

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

void spvPushOperandTypesForMask
               (spv_target_env env,spv_operand_table operandTable,spv_operand_type_t type,
               uint32_t mask,spv_operand_pattern_t *pattern)

{
  spv_result_t sVar1;
  spv_operand_type_t *types;
  uint value;
  bool bVar2;
  spv_operand_desc entry;
  spv_operand_desc local_38;
  
  types = (spv_operand_type_t *)(ulong)env;
  value = 0x80000000;
  do {
    if ((value & mask) != 0) {
      local_38 = (spv_operand_desc)0x0;
      sVar1 = spvOperandTableValueLookup((spv_target_env)types,operandTable,type,value,&local_38);
      if (sVar1 == SPV_SUCCESS) {
        types = local_38->operandTypes;
        spvPushOperandTypes(types,pattern);
      }
    }
    bVar2 = 1 < value;
    value = value >> 1;
  } while (bVar2);
  return;
}

Assistant:

void spvPushOperandTypesForMask(spv_target_env env,
                                const spv_operand_table operandTable,
                                const spv_operand_type_t type,
                                const uint32_t mask,
                                spv_operand_pattern_t* pattern) {
  // Scan from highest bits to lowest bits because we will append in LIFO
  // fashion, and we need the operands for lower order bits to be consumed first
  for (uint32_t candidate_bit = (1u << 31u); candidate_bit;
       candidate_bit >>= 1) {
    if (candidate_bit & mask) {
      spv_operand_desc entry = nullptr;
      if (SPV_SUCCESS == spvOperandTableValueLookup(env, operandTable, type,
                                                    candidate_bit, &entry)) {
        spvPushOperandTypes(entry->operandTypes, pattern);
      }
    }
  }
}